

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O0

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *pvVar5;
  size_type sVar6;
  reference ppIVar7;
  undefined4 extraout_var_01;
  undefined1 *in_RCX;
  INode *linkedNode;
  COLLADACsymbol *csymbol;
  size_t count_2;
  size_t i_2;
  NodeList *operands_2;
  FunctionExpression *func;
  UnaryExpression *unary;
  size_t count_1;
  size_t i_1;
  NodeList *operands_1;
  LogicExpression *logical;
  FragmentExpression *fragment;
  BinaryComparisonExpression *comparison;
  size_t count;
  size_t i;
  NodeList *operands;
  ArithmeticExpression *arithmetic;
  ulong local_98;
  ulong local_70;
  ulong local_40;
  char *local_8;
  
  uVar1 = (**(code **)(*(long *)__to + 0x18))();
  local_8 = __to;
  switch(uVar1) {
  case 0:
  case 2:
    *in_RCX = 1;
    break;
  case 1:
    pcVar4 = (char *)(**(code **)(*(long *)__to + 0x48))();
    iVar2 = link(this,__from,pcVar4);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar2);
    break;
  case 3:
    pvVar5 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             (**(code **)(*(long *)__to + 0x50))();
    local_70 = 0;
    sVar6 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(pvVar5);
    for (; local_70 < sVar6; local_70 = local_70 + 1) {
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_70);
      iVar2 = link(this,__from,(char *)*ppIVar7);
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_70);
      *ppIVar7 = (value_type)CONCAT44(extraout_var_00,iVar2);
    }
    break;
  case 4:
    pcVar4 = (char *)(**(code **)(*(long *)__to + 0x48))();
    iVar2 = link(this,__from,pcVar4);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar2);
    pcVar4 = (char *)(**(code **)(*(long *)__to + 0x58))();
    iVar2 = link(this,__from,pcVar4);
    (**(code **)(*(long *)__to + 0x60))(__to,iVar2);
    break;
  case 5:
    pvVar5 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             (**(code **)(*(long *)__to + 0x50))();
    local_40 = 0;
    sVar6 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(pvVar5);
    for (; local_40 < sVar6; local_40 = local_40 + 1) {
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_40);
      iVar2 = link(this,__from,(char *)*ppIVar7);
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_40);
      *ppIVar7 = (value_type)CONCAT44(extraout_var,iVar2);
    }
    break;
  case 6:
    pvVar5 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             (**(code **)(*(long *)__to + 0x38))();
    local_98 = 0;
    sVar6 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(pvVar5);
    for (; local_98 < sVar6; local_98 = local_98 + 1) {
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_98);
      iVar2 = link(this,__from,(char *)*ppIVar7);
      ppIVar7 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                          (pvVar5,local_98);
      *ppIVar7 = (value_type)CONCAT44(extraout_var_01,iVar2);
    }
    break;
  case 7:
    pcVar4 = (char *)(**(code **)(*(long *)__to + 0x30))();
    iVar2 = link(this,__from,pcVar4);
    (**(code **)(*(long *)__to + 0x38))(__to,iVar2);
    break;
  case 8:
    uVar3 = link(this,__from,__to);
    local_8 = (char *)(ulong)uVar3;
    if (__to != (char *)0x0) {
      (**(code **)(*(long *)__to + 8))();
    }
    break;
  default:
    local_8 = (char *)0x0;
  }
  return (int)local_8;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, MathML::AST::INode* astNode, bool& success)
	{
		switch ( astNode->getNodeType() )
		{
		case MathML::AST::INode::ARITHMETIC:
			{
				MathML::AST::ArithmeticExpression* arithmetic = (MathML::AST::ArithmeticExpression*)astNode;
				MathML::AST::NodeList& operands = arithmetic->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::COMPARISON:
			{
				MathML::AST::BinaryComparisonExpression* comparison = (MathML::AST::BinaryComparisonExpression*)astNode;
				comparison->setLeftOperand(link(formula, comparison->getLeftOperand(), success));
				comparison->setRightOperand(link(formula, comparison->getRightOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::CONSTANT:
		case MathML::AST::INode::VARIABLE:
			success = true;
			return astNode;
		case MathML::AST::INode::FRAGMENT:
			{
				MathML::AST::FragmentExpression* fragment = (MathML::AST::FragmentExpression*)astNode;
				fragment->setFragment( link( formula, fragment->getFragment(), success) );
			}
			return astNode;
		case MathML::AST::INode::LOGICAL:
			{
				MathML::AST::LogicExpression* logical = (MathML::AST::LogicExpression*)astNode;
				MathML::AST::NodeList& operands = logical->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::UNARY:
			{
				MathML::AST::UnaryExpression* unary = (MathML::AST::UnaryExpression*)astNode;
				unary->setOperand(link(formula, unary->getOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::FUNCTION:
			{
				MathML::AST::FunctionExpression* func = (MathML::AST::FunctionExpression*)astNode;
				MathML::AST::NodeList& operands = func->getParameterList();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::USERDEFINED:
			{
				COLLADACsymbol* csymbol = (COLLADACsymbol*) astNode;
				MathML::AST::INode* linkedNode = link( formula, csymbol, success );
				delete csymbol;
				return linkedNode;
			}
		default:
			COLLADABU_ASSERT(false);
		}
		return 0;
	}